

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O3

void ypr_status(lys_ypr_ctx_conflict *pctx,uint16_t flags,void *exts,int8_t *flag)

{
  char *text;
  
  if ((flags & 4) == 0) {
    if ((flags & 8) == 0) {
      if ((flags & 0x10) == 0) {
        text = (char *)0x0;
        goto LAB_001943f5;
      }
      text = "obsolete";
    }
    else {
      text = "deprecated";
    }
  }
  else {
    text = "current";
  }
  if ((flag != (int8_t *)0x0) && (*flag == '\0')) {
    *flag = '\x01';
    ly_print_((pctx->field_0).field_0.out,">\n");
  }
LAB_001943f5:
  ypr_substmt(pctx,LY_STMT_STATUS,'\0',text,exts);
  return;
}

Assistant:

static void
ypr_status(struct lys_ypr_ctx *pctx, uint16_t flags, void *exts, int8_t *flag)
{
    const char *status = NULL;

    if (flags & LYS_STATUS_CURR) {
        ypr_close_parent(pctx, flag);
        status = "current";
    } else if (flags & LYS_STATUS_DEPRC) {
        ypr_close_parent(pctx, flag);
        status = "deprecated";
    } else if (flags & LYS_STATUS_OBSLT) {
        ypr_close_parent(pctx, flag);
        status = "obsolete";
    }

    ypr_substmt(pctx, LY_STMT_STATUS, 0, status, exts);
}